

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rain-risk.cpp
# Opt level: O0

value_type compass_relative(compass_e e,dir_e d,int steps)

{
  const_iterator __first;
  borrowed_iterator_t<const_std::array<compass_e,_4UL>_&> __last;
  iter_difference_t<const_compass_e_*> iVar1;
  size_type sVar2;
  const_reference pvVar3;
  int size;
  int i;
  int steps_local;
  dir_e d_local;
  compass_e e_local;
  
  i._2_1_ = d;
  i._3_1_ = e;
  __first = std::array<compass_e,_4UL>::cbegin(&compass);
  __last = std::ranges::__find_fn::
           operator()<const_std::array<compass_e,_4UL>_&,_compass_e,_std::identity>
                     ((__find_fn *)&std::ranges::find,&compass,(long)&i + 3);
  iVar1 = std::ranges::__distance_fn::operator()<const_compass_e_*,_const_compass_e_*>
                    ((__distance_fn *)&std::ranges::distance,__first,__last);
  size = (int)iVar1;
  sVar2 = std::array<std::pair<int,_int>,_4UL>::size(&compass_dir);
  if (i._2_1_ == Left) {
    size = size - steps;
  }
  else if (i._2_1_ == Right) {
    size = steps + size;
  }
  pvVar3 = std::array<compass_e,_4UL>::operator[](&compass,(long)((size + (int)sVar2) % (int)sVar2))
  ;
  return *pvVar3;
}

Assistant:

static constexpr auto compass_relative(compass_e e, dir_e d, int steps = 1) {
  int i = ranges::distance(compass.cbegin(), ranges::find(compass, e));
  int size = compass_dir.size();
  switch (d) {
    case dir_e::Left: i-=steps; break;
    case dir_e::Right: i+=steps; break;
    default: break;
  }
  i = (i + size) % size;
  return compass[i];
}